

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandDetector.cpp
# Opt level: O2

void __thiscall HandDetector::checkHands(HandDetector *this)

{
  long lVar1;
  Hand *pHVar2;
  bool bVar3;
  vector<Hand,_std::allocator<Hand>_> *__range1;
  long lVar4;
  
  lVar1 = *(long *)this;
  pHVar2 = *(Hand **)(this + 8);
  for (lVar4 = 0; (Hand *)(lVar1 + lVar4) != pHVar2; lVar4 = lVar4 + 0x200) {
    bVar3 = Hand::checkSize((Hand *)(lVar1 + lVar4));
    if ((!bVar3) || (*(long *)(lVar1 + 0x70 + lVar4) == *(long *)(lVar1 + 0x78 + lVar4))) {
      std::vector<Hand,_std::allocator<Hand>_>::erase
                ((vector<Hand,_std::allocator<Hand>_> *)this,(Hand *)(*(long *)this + lVar4));
    }
  }
  return;
}

Assistant:

void HandDetector::checkHands() {
    int i = 0;
    for (Hand &h : hands) {
        if (!h.checkSize() || h.fingers.empty())
            hands.erase(hands.begin() + i);
        i++;
    }
}